

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

void nn_xreq_rm(nn_sockbase *self,nn_pipe *pipe)

{
  int increment;
  nn_lb_data *data_00;
  nn_sockbase *local_30;
  nn_xreq_data *data;
  nn_xreq *xreq;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_30 = self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_sockbase *)0x0;
  }
  data_00 = (nn_lb_data *)nn_pipe_getdata(pipe);
  nn_lb_rm((nn_lb *)(local_30 + 1),data_00);
  nn_fq_rm((nn_fq *)&local_30[0x19].sock,(nn_fq_data *)(data_00 + 1));
  nn_free(data_00);
  increment = nn_lb_get_priority((nn_lb *)(local_30 + 1));
  nn_sockbase_stat_increment(self,0x191,increment);
  return;
}

Assistant:

void nn_xreq_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;

    xreq = nn_cont (self, struct nn_xreq, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_lb_rm (&xreq->lb, &data->lb);
    nn_fq_rm (&xreq->fq, &data->fq);
    nn_free (data);

    nn_sockbase_stat_increment (self, NN_STAT_CURRENT_SND_PRIORITY,
        nn_lb_get_priority (&xreq->lb));
}